

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bet.cpp
# Opt level: O3

uint __thiscall Bet::selectBet(Bet *this,uint *bet,double *credit)

{
  double *credits;
  int iVar1;
  ostream *poVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> betVector;
  CreditField repeatInput;
  uint FiveEuro;
  uint FourEuro;
  uint threeEuro;
  uint twoEuro;
  string y;
  string confirm;
  string okay;
  uint oneEuro;
  SelectGame selectgame;
  uint *local_108;
  iterator iStack_100;
  uint *local_f8;
  double *local_f0;
  ulong local_e8;
  ulong local_e0;
  CreditField local_d8;
  uint local_d0 [4];
  byte *local_c0;
  long local_b8;
  byte local_b0;
  undefined7 uStack_af;
  undefined1 *local_a0;
  char *local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  long *local_80;
  char *local_78;
  long local_70 [2];
  uint local_5c;
  Start local_58;
  
  local_108 = (uint *)0x0;
  iStack_100._M_current = (uint *)0x0;
  local_f8 = (uint *)0x0;
  local_5c = 1;
  local_f0 = credit;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_108,(iterator)0x0,&local_5c
            );
  local_d0[3] = 2;
  if (iStack_100._M_current == local_f8) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_108,iStack_100,
               local_d0 + 3);
  }
  else {
    *iStack_100._M_current = 2;
    iStack_100._M_current = iStack_100._M_current + 1;
  }
  local_d0[2] = 3;
  if (iStack_100._M_current == local_f8) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_108,iStack_100,
               local_d0 + 2);
  }
  else {
    *iStack_100._M_current = 3;
    iStack_100._M_current = iStack_100._M_current + 1;
  }
  local_d0[1] = 4;
  if (iStack_100._M_current == local_f8) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_108,iStack_100,
               local_d0 + 1);
  }
  else {
    *iStack_100._M_current = 4;
    iStack_100._M_current = iStack_100._M_current + 1;
  }
  local_d0[0] = 5;
  if (iStack_100._M_current == local_f8) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_108,iStack_100,local_d0);
  }
  else {
    *iStack_100._M_current = 5;
    iStack_100._M_current = iStack_100._M_current + 1;
  }
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"ok","");
  local_a0 = &local_90;
  local_98 = (char *)0x0;
  local_90 = 0;
  local_c0 = &local_b0;
  local_b8 = 0;
  local_b0 = 0;
  CreditField::CreditField(&local_d8);
  credits = &this->_credit_bet;
  while (*credits <= 1.0 && *credits != 1.0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Please insert Credit! The minimum is 1 Euro! ",0x2d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    CreditField::AddCredit(&local_d8,credits);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,">>>The minimum bet is: ",0x17);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," Euro and the max bet is: ",0x1a);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," Euro! ",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">>>Current Bet: ",0x10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," Euro",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (1.0 <= *credits) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,">>>Please, Select Bet! ",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    dVar6 = *credits;
    if (5.0 <= dVar6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,">>>Play On Max Bet!",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      dVar6 = *credits;
    }
    if (dVar6 < 5.0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,">>>Insert credit to play on max bet! ",0x25);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "********************************************************************************************************************"
               ,0x74);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    local_e8 = 0;
    local_e0 = 0;
    do {
      if ((local_98 == local_78) &&
         ((local_98 == (char *)0x0 || (iVar1 = bcmp(local_a0,local_80,(size_t)local_98), iVar1 == 0)
          ))) break;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"---Press y to increase the bet! ",0x20);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"---Press n to decrease the bet!",0x1f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"---Press q to quit!",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"---Press o to play with current bet!",0x24);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"---Press m for more games!",0x1a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "********************************************************************************************************************"
                 ,0x74);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      std::operator>>((istream *)&std::cin,(string *)&local_c0);
      if (iStack_100._M_current != local_108) {
        uVar5 = 0;
        do {
          bVar3 = *local_c0;
          if (bVar3 < 0x71) {
            if (bVar3 == 0x6d) {
              if (local_b8 == 1) {
                SelectGame::SelectGame((SelectGame *)&local_58);
                SelectGame::selectGame_Welcome((SelectGame *)&local_58);
                SelectGame::selectGame_Games((SelectGame *)&local_58);
                SelectGame::selectGame_Option((SelectGame *)&local_58,local_f0);
                SelectGame::~SelectGame((SelectGame *)&local_58);
                bVar3 = *local_c0;
                goto LAB_001058be;
              }
            }
            else if (bVar3 == 0x6e) {
              if (local_b8 == 1) {
                if (local_108[uVar5] < 2) {
                  local_108[uVar5] = 1;
                  *bet = 1;
                  uVar5 = (ulong)((int)local_e0 + 1);
                  if (-1 < (int)local_e0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"You are already playing on minimum bet!",0x27)
                    ;
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
                    std::ostream::put(-8);
                    std::ostream::flush();
                  }
                }
                else {
                  uVar4 = local_108[uVar5] - 1;
                  local_108[uVar5] = uVar4;
                  *bet = uVar4;
                  uVar5 = 0;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Your Current bet is: ",0x15);
                poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2," Euro",5);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
                std::ostream::put((char)poVar2);
                std::ostream::flush();
                local_e0 = uVar5;
                break;
              }
            }
            else {
LAB_001058be:
              if ((bVar3 == 0x6f) && (local_b8 == 1)) {
                *bet = local_108[uVar5];
                Start::Start(&local_58);
                Start::StartGameNow(&local_58,credits,bet);
                std::__cxx11::string::_M_replace((ulong)&local_a0,0,local_98,0x150028);
                Start::~Start(&local_58);
                break;
              }
            }
          }
          else if (bVar3 == 0x71) {
            if (local_b8 == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Cashout...",10);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
              std::ostream::put(-8);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Handpay! Call Attendant! ",0x19);
              poVar2 = std::ostream::_M_insert<double>(*credits);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2," Euro!",6);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
              std::ostream::put((char)poVar2);
              std::ostream::flush();
              SelectGame::SelectGame((SelectGame *)&local_58);
              SelectGame::selectGame_Welcome((SelectGame *)&local_58);
              SelectGame::selectGame_Games((SelectGame *)&local_58);
              *local_f0 = 0.0;
              SelectGame::selectGame_Option((SelectGame *)&local_58,local_f0);
              SelectGame::~SelectGame((SelectGame *)&local_58);
              break;
            }
          }
          else {
            if (bVar3 != 0x79) goto LAB_001058be;
            if (local_b8 == 1) {
              dVar6 = *credits;
              if (dVar6 <= (double)*bet) {
                if (((*bet != 5) || (*local_f0 != 5.0)) || (NAN(*local_f0))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Not enough credits to increase the bet!",0x27);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
                  std::ostream::put(-8);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Credits: ",9);
                  poVar2 = std::ostream::_M_insert<double>(*credits);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
                  std::ostream::put((char)poVar2);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Bet: ",5);
                  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"You are already playing on max bet!",0x23);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
                  std::ostream::put(-8);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Your Current bet is: ",0x15);
                  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2," Euro",5);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
                }
                std::ostream::put((char)poVar2);
                std::ostream::flush();
              }
              else {
                if (local_108[uVar5] < 5) {
                  if ((*local_f0 == 1.0) && (!NAN(*local_f0))) {
                    *bet = 1;
                  }
                  uVar4 = 1;
                  if ((dVar6 != 1.0) || (NAN(dVar6))) {
                    uVar4 = local_108[uVar5] + 1;
                    local_108[uVar5] = uVar4;
                  }
                  *bet = uVar4;
                  local_e0 = 0;
                }
                else {
                  local_108[uVar5] = 5;
                  *bet = 5;
                  local_e8 = (ulong)((int)local_e8 + 1);
                }
                if (0 < (int)local_e8) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"You are already playing on max bet!",0x23);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
                  std::ostream::put(-8);
                  std::ostream::flush();
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Your Current bet is: ",0x15);
                poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2," Euro",5);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
                std::ostream::put((char)poVar2);
                std::ostream::flush();
              }
              break;
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Invalid Input",0xd);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
          std::ostream::put(-8);
          std::ostream::flush();
          *bet = 1;
          std::operator>>((istream *)&std::cin,(string *)&local_c0);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)((long)iStack_100._M_current - (long)local_108 >> 2));
      }
    } while( true );
  }
  uVar4 = *bet;
  CreditField::~CreditField(&local_d8);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_108 != (uint *)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  return uVar4;
}

Assistant:

unsigned int Bet::selectBet(unsigned int& bet, double &credit) {

	std::vector<unsigned int> betVector;
	unsigned const int oneEuro = 1;
	betVector.push_back(oneEuro);
	unsigned const int twoEuro = 2;
	betVector.push_back(twoEuro);
	unsigned const int threeEuro = 3;
	betVector.push_back(threeEuro);
	unsigned const int FourEuro = 4;
	betVector.push_back(FourEuro);
	unsigned const int FiveEuro = 5;
	betVector.push_back(FiveEuro);
	
	std::string okay = "ok";
	std::string confirm;
	std::string y; 
	int countAbove = 0; 
	int countBelow = 0; 
	
	//if credit < 1
	//if credit < 5
	//if credit< cannot increase!
	CreditField repeatInput;

	while (_credit_bet < oneEuro) {
	
		std::cout << "Please insert Credit! The minimum is 1 Euro! " << std::endl;
		repeatInput.AddCredit(_credit_bet);
		
	}
	std::cout << ">>>The minimum bet is: " << oneEuro << " Euro and the max bet is: " << FiveEuro << " Euro! " << std::endl;
	std::cout << ">>>Current Bet: " << betVector[0] << " Euro" << std::endl;
	if (_credit_bet >= oneEuro) {
		std::cout << ">>>Please, Select Bet! " << std::endl;
		if (_credit_bet >= FiveEuro) {
			std::cout << ">>>Play On Max Bet!" << std::endl;
		}
		if (_credit_bet < FiveEuro) {
			std::cout << ">>>Insert credit to play on max bet! " << std::endl;
		}
		std::cout << "********************************************************************************************************************" << std::endl;
		while (confirm != okay) {
			std::cout << "---Press y to increase the bet! " << std::endl;
			std::cout << "---Press n to decrease the bet!" << std::endl;
			std::cout << "---Press q to quit!" << std::endl;
			std::cout << "---Press o to play with current bet!" << std::endl;
			std::cout << "---Press m for more games!" << std::endl;
			std::cout << "********************************************************************************************************************" << std::endl;
			std::cin >> y;
			//new code here for safety
			/*while (y.size() > 1) {
				
				std::cin >> y;
			}*/
			for (int i = 0; i < betVector.size(); i++) {
				if (y[0] == 'y' && y.size()==1 ) {
					if (_credit_bet <= bet) {
						if (credit == FiveEuro && bet == FiveEuro) {
							std::cout << "You are already playing on max bet!" << std::endl;
							std::cout << "Your Current bet is: " << bet << " Euro" << std::endl;
							break;
						}
						else {
							std::cout << "Not enough credits to increase the bet!" << std::endl;
							std::cout << "Credits: " << _credit_bet << std::endl;
							std::cout << "Bet: " << bet << std::endl;

							break;
						}
						
					}
					else {
						
						if (betVector[i] >= FiveEuro) {
							betVector[i] = FiveEuro;
							bet = betVector[i];
							countAbove++;
						}
						else {
							if (credit == oneEuro) {
								bet = oneEuro;
							}
							if (_credit_bet == oneEuro) {
								bet = oneEuro;
							}
							else {

								betVector[i] += oneEuro;
								bet = betVector[i];
							}
							
							countBelow = 0;
						}
						if (countAbove > 0) {
							std::cout << "You are already playing on max bet!" << std::endl;
						}
						std::cout << "Your Current bet is: " << bet << " Euro" << std::endl;
						break;
					}
					
				}
				if (y[0] == 'n' && y.size() == 1) {

					if (betVector[i] <= oneEuro) {
						betVector[i] = oneEuro;
						bet = betVector[i];
						countBelow++;
					}
					else {
						betVector[i] -= 1;
						bet = betVector[i];
						countBelow = 0;
					}
					if (countBelow > 0) {
						std::cout << "You are already playing on minimum bet!" << std::endl;
					}
					std::cout << "Your Current bet is: " << bet << " Euro" << std::endl;
					break;
				}
				if (y[0] == 'q' && y.size() == 1) {
					std::cout << "Cashout..." << std::endl;
					std::cout << "Handpay! Call Attendant! " << _credit_bet << " Euro!" << std::endl;
					//std::chrono::seconds duration(3);
					//std::this_thread::sleep_for(duration);
					SelectGame selectgame;
					selectgame.selectGame_Welcome();
					selectgame.selectGame_Games();
					credit = 0;
					//choosing a game
					selectgame.selectGame_Option(credit);
					
					//exit(0);
					break;
				}
				if (y[0] == 'm' && y.size() == 1) {
					SelectGame selectgame;
					selectgame.selectGame_Welcome();
					selectgame.selectGame_Games();

					//choosing a game
					selectgame.selectGame_Option(credit);
				}
				
				if (y[0] == 'o'  && y.size() == 1) {
					bet = betVector[i];
					Start startgame;
					startgame.StartGameNow(_credit_bet, bet);
					confirm = "ok";
					break;
				}
				else {
					std::cout << "Invalid Input" << std::endl;
					bet = oneEuro;
					std::cin >> y;
				}
			}
		}
	}
	return bet;
}